

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OjaNewton.cc
# Opt level: O0

void update_wbar_and_Zx(update_data_conflict *data,float x,float *wref)

{
  float fVar1;
  int iVar2;
  float *in_RSI;
  long *in_RDI;
  float in_XMM0_Da;
  double dVar3;
  int i;
  float g;
  int m;
  float *w;
  int local_2c;
  float local_c;
  
  iVar2 = *(int *)(*in_RDI + 8);
  local_c = in_XMM0_Da;
  if ((*(byte *)(*in_RDI + 0xac) & 1) != 0) {
    dVar3 = std::sqrt((double)(ulong)(uint)in_RSI[iVar2 + 1]);
    local_c = in_XMM0_Da / SUB84(dVar3,0);
  }
  fVar1 = *(float *)(in_RDI + 1);
  for (local_2c = 1; local_2c <= iVar2; local_2c = local_2c + 1) {
    *(float *)(in_RDI[3] + (long)local_2c * 4) =
         in_RSI[local_2c] * local_c * *(float *)(*(long *)(*in_RDI + 0x30) + (long)local_2c * 4) +
         *(float *)(in_RDI[3] + (long)local_2c * 4);
  }
  *in_RSI = *in_RSI - (fVar1 * local_c) / *(float *)(*in_RDI + 0x10);
  return;
}

Assistant:

void update_wbar_and_Zx(update_data& data, float x, float& wref)
{
  float* w = &wref;
  int m = data.ON->m;
  if (data.ON->normalize)
    x /= sqrt(w[NORM2]);

  float g = data.g * x;

  for (int i = 1; i <= m; i++)
  {
    data.Zx[i] += w[i] * x * data.ON->D[i];
  }
  w[0] -= g / data.ON->alpha;
}